

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O3

bool __thiscall
BuildLog::Restat(BuildLog *this,StringPiece path,DiskInterface *disk_interface,int output_count,
                char **outputs,string *err)

{
  char *pcVar1;
  Metrics *this_00;
  int iVar2;
  long *plVar3;
  FILE *__stream;
  _Hash_node_base *p_Var4;
  int *piVar5;
  char *pcVar6;
  Metric *pMVar7;
  size_type *psVar8;
  bool bVar9;
  ulong uVar10;
  _Hash_node_base _Var11;
  __node_base *p_Var12;
  string temp_path;
  ScopedMetric metrics_h_scoped;
  string local_88;
  char *local_68;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  ScopedMetric local_40;
  
  local_68 = path.str_;
  if (Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)::metrics_h_metric ==
      '\0') {
    iVar2 = __cxa_guard_acquire(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)
                                 ::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar2 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar7 = (Metric *)0x0;
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,".ninja_log restat","");
        pMVar7 = Metrics::NewMetric(this_00,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      Restat::metrics_h_metric = pMVar7;
      __cxa_guard_release(&Restat(StringPiece,DiskInterface_const&,int,char**,std::__cxx11::string*)
                           ::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_40,Restat::metrics_h_metric);
  Close(this);
  local_60 = &local_50;
  if (path.len_ == 0) {
    local_58 = 0;
    local_50 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,local_68,local_68 + path.len_);
  }
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  psVar8 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88.field_2._8_8_ = plVar3[3];
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar8;
    local_88._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_88._M_string_length = plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  __stream = fopen(local_88._M_dataplus._M_p,"wb");
  if (__stream == (FILE *)0x0) {
LAB_001066dc:
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar1 = (char *)err->_M_string_length;
    strlen(pcVar6);
    bVar9 = false;
    std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar6);
  }
  else {
    iVar2 = fprintf(__stream,"# ninja log v%d\n",5);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar1 = (char *)err->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar6);
    }
    else {
      p_Var12 = &(this->entries_)._M_h._M_before_begin;
      do {
        p_Var12 = p_Var12->_M_nxt;
        if (p_Var12 == (__node_base *)0x0) {
          fclose(__stream);
          iVar2 = unlink(local_68);
          if (iVar2 < 0) goto LAB_001066dc;
          iVar2 = rename(local_88._M_dataplus._M_p,local_68);
          bVar9 = true;
          if (iVar2 < 0) goto LAB_001066dc;
          goto LAB_00106715;
        }
        if (output_count < 1) {
LAB_001065df:
          p_Var4 = (_Hash_node_base *)
                   (**(code **)(*(long *)disk_interface + 0x18))
                             (disk_interface,p_Var12[3]._M_nxt,err);
          if (p_Var4 == (_Hash_node_base *)0xffffffffffffffff) goto LAB_001066a5;
          _Var11._M_nxt = p_Var12[3]._M_nxt;
          _Var11._M_nxt[6]._M_nxt = p_Var4;
        }
        else {
          uVar10 = 0;
          do {
            iVar2 = std::__cxx11::string::compare((char *)p_Var12[3]._M_nxt);
            if (iVar2 == 0) goto LAB_001065df;
            uVar10 = uVar10 + 1;
          } while ((uint)output_count != uVar10);
          if (output_count < 1) goto LAB_001065df;
          _Var11._M_nxt = p_Var12[3]._M_nxt;
          p_Var4 = _Var11._M_nxt[6]._M_nxt;
        }
        iVar2 = fprintf(__stream,"%d\t%d\t%ld\t%s\t%lx\n",(ulong)*(uint *)&_Var11._M_nxt[5]._M_nxt,
                        (ulong)*(uint *)((long)&_Var11._M_nxt[5]._M_nxt + 4),p_Var4,
                        (_Var11._M_nxt)->_M_nxt,_Var11._M_nxt[4]._M_nxt);
      } while (0 < iVar2);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar1 = (char *)err->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)err,0,pcVar1,(ulong)pcVar6);
    }
LAB_001066a5:
    fclose(__stream);
    bVar9 = false;
  }
LAB_00106715:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar9;
}

Assistant:

bool BuildLog::Restat(const StringPiece path,
                      const DiskInterface& disk_interface,
                      const int output_count, char** outputs,
                      std::string* const err) {
  METRIC_RECORD(".ninja_log restat");

  Close();
  std::string temp_path = path.AsString() + ".restat";
  FILE* f = fopen(temp_path.c_str(), "wb");
  if (!f) {
    *err = strerror(errno);
    return false;
  }

  if (fprintf(f, kFileSignature, kCurrentVersion) < 0) {
    *err = strerror(errno);
    fclose(f);
    return false;
  }
  for (Entries::iterator i = entries_.begin(); i != entries_.end(); ++i) {
    bool skip = output_count > 0;
    for (int j = 0; j < output_count; ++j) {
      if (i->second->output == outputs[j]) {
        skip = false;
        break;
      }
    }
    if (!skip) {
      const TimeStamp mtime = disk_interface.Stat(i->second->output, err);
      if (mtime == -1) {
        fclose(f);
        return false;
      }
      i->second->mtime = mtime;
    }

    if (!WriteEntry(f, *i->second)) {
      *err = strerror(errno);
      fclose(f);
      return false;
    }
  }

  fclose(f);
  if (unlink(path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  if (rename(temp_path.c_str(), path.str_) < 0) {
    *err = strerror(errno);
    return false;
  }

  return true;
}